

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  undefined8 extraout_RDX;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  char cVar10;
  char *pcVar11;
  int i;
  long lVar12;
  ulong uVar13;
  char **ppcVar14;
  char **ppcVar15;
  char **unaff_R14;
  uint uVar16;
  char acStack_ba0 [208];
  undefined8 uStack_ad0;
  ulong uStack_ac8;
  ulong uStack_ac0;
  ulong uStack_ab8;
  ulong uStack_ab0;
  char *pcStack_aa8;
  ulong uStack_aa0;
  FILE *pFStack_a98;
  BuildCtx *pBStack_a90;
  BuildCtx ctx_;
  char buf [80];
  
  ctx_.mode = ~BUILD_elfasm;
  ctx_.outname = "-";
  pcVar7 = argv[1];
  iVar9 = 1;
  pcVar11 = (char *)argv;
  if (pcVar7 != (char *)0x0) {
    while (*pcVar7 == '-') {
      bVar1 = pcVar7[1];
      if (bVar1 < 0x6f) {
        if (bVar1 != 0x6d) {
          if (bVar1 != 0) {
            if ((bVar1 != 0x2d) || (pcVar7[2] != '\0')) goto LAB_0010744f;
            iVar9 = iVar9 + 1;
          }
          break;
        }
        if ((pcVar7[2] != '\0') ||
           (unaff_R14 = (char **)argv[iVar9 + 1], (BuildCtx *)unaff_R14 == (BuildCtx *)0x0))
        goto LAB_0010744f;
        ppcVar14 = modenames;
        lVar12 = 0;
        while( true ) {
          pcVar11 = *ppcVar14;
          pBStack_a90 = (BuildCtx *)0x1069b9;
          iVar4 = strcmp((char *)unaff_R14,pcVar11);
          if (iVar4 == 0) break;
          lVar12 = lVar12 + 1;
          ppcVar14 = ppcVar14 + 1;
          if (lVar12 == 0xb) goto LAB_0010744f;
        }
        ctx_.mode = (BuildMode)lVar12;
        pcVar7 = ctx_.outname;
      }
      else if (((bVar1 != 0x6f) || (pcVar7[2] != '\0')) ||
              (pcVar7 = argv[iVar9 + 1], argv[iVar9 + 1] == (char *)0x0)) goto LAB_0010744f;
      ctx_.outname = pcVar7;
      iVar4 = iVar9 + 1;
      iVar9 = iVar9 + 2;
      pcVar7 = argv[(long)iVar4 + 1];
      if (pcVar7 == (char *)0x0) break;
    }
  }
  ctx_.args = argv + iVar9;
  if (ctx_.mode == ~BUILD_elfasm) {
LAB_0010744f:
    pBStack_a90 = (BuildCtx *)0x107454;
    usage();
LAB_00107454:
    pBStack_a90 = (BuildCtx *)0x10745c;
    main_cold_3();
  }
  else {
    ctx_.nglob = 0x9e;
    pBStack_a90 = (BuildCtx *)0x106a5b;
    ctx_.glob = (void **)malloc(0x4f0);
    pBStack_a90 = (BuildCtx *)0x106a70;
    memset(ctx_.glob,0,0x4f0);
    ctx_.nreloc = 0;
    ppcVar14 = globnames;
    ctx_.globnames = globnames;
    ctx_.extnames = extnames;
    pBStack_a90 = (BuildCtx *)0x106a96;
    ctx_.relocsym = (char **)malloc(0x1e0);
    ctx_.nrelocsym = 0;
    pBStack_a90 = (BuildCtx *)0x106ab3;
    memset(relocmap,0xff,0xf0);
    ctx_.dasm_ident = "DynASM 1.5.0";
    ctx_.dasm_arch = "x86";
    pBStack_a90 = (BuildCtx *)0x106adc;
    dasm_init(&ctx_,2);
    pBStack_a90 = (BuildCtx *)0x106aeb;
    dasm_setupglobal(&ctx_,ctx_.glob,ctx_.nglob);
    pBStack_a90 = (BuildCtx *)0x106afa;
    dasm_setup(&ctx_,build_actionlist);
    pBStack_a90 = (BuildCtx *)0x106b02;
    build_backend(&ctx_);
    ctx_.npc = 0x61;
    if ((ctx_.D)->status == 0) {
      piVar3 = (ctx_.D)->lglabels;
      lVar12 = 1;
      do {
        if (0 < piVar3[lVar12]) {
          (ctx_.D)->status = (int)lVar12 + 0x21000000;
          break;
        }
        piVar3[lVar12] = 0;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 10);
    }
    pBStack_a90 = (BuildCtx *)0x106b4a;
    uVar5 = dasm_link(&ctx_,&ctx_.codesz);
    if (uVar5 == 0) {
      pBStack_a90 = (BuildCtx *)0x106b5c;
      ctx_.code = (uint8_t *)malloc(CONCAT44(ctx_.codesz._4_4_,(int)ctx_.codesz));
      pBStack_a90 = (BuildCtx *)0x106b6b;
      uVar5 = dasm_encode(&ctx_,ctx_.code);
      if (uVar5 != 0) goto LAB_00106b73;
      pBStack_a90 = (BuildCtx *)0x106d2f;
      ctx_.beginsym = sym_decorate(&ctx_,"","lj_vm_asm_begin");
      unaff_R14 = (char **)(long)ctx_.npc;
      pBStack_a90 = (BuildCtx *)0x106d4b;
      ctx_.sym = (BuildSym *)malloc((long)(ctx_.nglob + ctx_.npc + 1) << 4);
      ctx_.nsym = 0;
      pBStack_a90 = (BuildCtx *)0x106d63;
      ctx_.bc_ofs = (int32_t *)malloc((long)unaff_R14 * 4);
      if (0 < (long)unaff_R14) {
        ppcVar15 = bc_names;
        unaff_R14 = (char **)0x0;
        lVar12 = 0;
        do {
          if (unaff_R14 < (BuildCtx *)(ctx_.D)->pcsize) {
            iVar9 = *(int *)((long)(ctx_.D)->pclabels + (long)unaff_R14);
            if (iVar9 < 0) {
              iVar4 = (ctx_.D)->sections[(uint)-iVar9 >> 0x18].rbuf[(uint)-iVar9];
            }
            else {
              iVar4 = -1;
            }
            if (iVar9 == 0) goto LAB_00106db7;
          }
          else {
LAB_00106db7:
            iVar4 = -2;
          }
          if (iVar4 < 0) {
            argv = (char **)(ulong)((uint)lVar12 | 0x22000000);
            goto LAB_00106b75;
          }
          *(int *)((long)ctx_.bc_ofs + (long)unaff_R14) = iVar4;
          pBStack_a90 = (BuildCtx *)0x106de0;
          sym_insert(&ctx_,iVar4,"lj_BC_",*ppcVar15);
          lVar12 = lVar12 + 1;
          unaff_R14 = (char **)((long)&((BuildCtx *)unaff_R14)->D + 4);
          ppcVar15 = ppcVar15 + 1;
        } while (lVar12 < ctx_.npc);
      }
      if (0 < ctx_.nglob) {
        lVar12 = 0;
        unaff_R14 = (char **)&ctx_;
        do {
          pcVar7 = *ppcVar14;
          pBStack_a90 = (BuildCtx *)0x106e33;
          sVar6 = strlen(pcVar7);
          pcVar11 = (char *)ctx_.glob[lVar12];
          argv = (char **)"lj_";
          if ((char **)pcVar11 == (char **)0x0) goto LAB_00107454;
          iVar9 = (int)sVar6;
          if (((iVar9 < 2) || (pcVar7[iVar9 - 2] != '_')) || (pcVar7[iVar9 - 1] != 'Z')) {
            pBStack_a90 = (BuildCtx *)0x106e73;
            sym_insert((BuildCtx *)unaff_R14,(int)pcVar11 - (int)ctx_.code,"lj_",pcVar7);
          }
          lVar12 = lVar12 + 1;
          ppcVar14 = ppcVar14 + 1;
        } while (lVar12 < ctx_.nglob);
      }
      pBStack_a90 = (BuildCtx *)0x106e9e;
      sym_insert(&ctx_,(int)ctx_.codesz,"","");
      ctx_.nsym = ctx_.nsym + -1;
      pBStack_a90 = (BuildCtx *)0x106ea9;
      dasm_free(&ctx_);
      argv = (char **)0x0;
    }
    else {
LAB_00106b73:
      argv = (char **)(ulong)uVar5;
    }
LAB_00106b75:
    if ((int)argv != 0) {
      pBStack_a90 = (BuildCtx *)0x1073c0;
      fprintf(_stderr,"Error: DASM error %08x\n",argv);
      return 1;
    }
    pcVar11 = "w";
    if (ctx_.mode - BUILD_peobj < 2) {
      pcVar11 = "wb";
    }
    if ((*ctx_.outname == '-') && (ctx_.outname[1] == '\0')) {
      ctx_.fp = _stdout;
    }
    else {
      pBStack_a90 = (BuildCtx *)0x106bb2;
      ctx_.fp = (FILE *)fopen(ctx_.outname,pcVar11);
      if ((FILE *)ctx_.fp == (FILE *)0x0) goto LAB_00107461;
    }
    switch(ctx_.mode) {
    case BUILD_elfasm:
    case BUILD_coffasm:
    case BUILD_machasm:
      pBStack_a90 = (BuildCtx *)0x106beb;
      emit_asm(&ctx_);
      if (ctx_.mode == BUILD_machasm) {
        pBStack_a90 = (BuildCtx *)0x106ecb;
        fwrite("\t.section __TEXT,__eh_frame,coalesced,no_toc+strip_static_syms+live_support\n",0x4c
               ,1,(FILE *)ctx_.fp);
        pBStack_a90 = (BuildCtx *)0x106ee6;
        fwrite("EH_frame1:\n\t.set L$set$x,LECIEX-LSCIEX\n\t.long L$set$x\nLSCIEX:\n\t.long 0\n\t.byte 0x1\n\t.ascii \"zPR\\0\"\n\t.byte 0x1\n\t.byte 128-8\n\t.byte 0x10\n\t.byte 6\n\t.byte 0x9b\n\t.long _lj_err_unwind_dwarf+4@GOTPCREL\n\t.byte 0x1b\n\t.byte 0xc\n\t.byte 0x7\n\t.byte 8\n\t.byte 0x80+0x10\n\t.byte 0x1\n\t.align 3\nLECIEX:\n\n"
               ,0x11c,1,(FILE *)ctx_.fp);
        if (ctx_.nsym < 1) {
          uVar5 = 0;
        }
        else {
          lVar12 = 0;
          uVar13 = 0;
          uVar8 = 0;
          do {
            uVar16 = *(int *)((long)&ctx_.sym[1].ofs + lVar12) -
                     *(int *)((long)&(ctx_.sym)->ofs + lVar12);
            uVar5 = uVar8;
            if (uVar16 != 0) {
              pcVar7 = *(char **)((long)&(ctx_.sym)->name + lVar12);
              pBStack_a90 = (BuildCtx *)0x106f1f;
              iVar9 = strcmp(pcVar7,"_lj_vm_ffi_call");
              uVar5 = uVar16;
              if (iVar9 != 0) {
                pFStack_a98 = (FILE *)0x50;
                uStack_ad0 = 0x106f52;
                uStack_ac8 = uVar13;
                uStack_ac0 = uVar13;
                uStack_ab8 = uVar13;
                uStack_ab0 = uVar13;
                pcStack_aa8 = pcVar7;
                uStack_aa0 = (ulong)uVar16;
                pBStack_a90 = (BuildCtx *)uVar13;
                fprintf((FILE *)ctx_.fp,
                        "%s.eh:\nLSFDE%d:\n\t.set L$set$%d,LEFDE%d-LASFDE%d\n\t.long L$set$%d\nLASFDE%d:\n\t.long LASFDE%d-EH_frame1\n\t.long %s-.\n\t.long %d\n\t.byte 0\n\t.byte 0xe\n\t.byte %d\n\t.byte 0x86\n\t.byte 0x2\n\t.byte 0x83\n\t.byte 0x3\n\t.byte 0x8f\n\t.byte 0x4\n\t.byte 0x8e\n\t.byte 0x5\n\t.align 3\nLEFDE%d:\n\n"
                        ,pcVar7,uVar13 & 0xffffffff,uVar13 & 0xffffffff,uVar13 & 0xffffffff);
                uVar5 = uVar8;
              }
            }
            uVar13 = uVar13 + 1;
            lVar12 = lVar12 + 0x10;
            unaff_R14 = (char **)"_lj_vm_ffi_call";
            uVar8 = uVar5;
          } while ((long)uVar13 < (long)ctx_.nsym);
        }
        if (uVar5 != 0) {
          pBStack_a90 = (BuildCtx *)0x1073e8;
          fwrite("EH_frame2:\n\t.set L$set$y,LECIEY-LSCIEY\n\t.long L$set$y\nLSCIEY:\n\t.long 0\n\t.byte 0x1\n\t.ascii \"zR\\0\"\n\t.byte 0x1\n\t.byte 128-8\n\t.byte 0x10\n\t.byte 1\n\t.byte 0x1b\n\t.byte 0xc\n\t.byte 0x7\n\t.byte 8\n\t.byte 0x80+0x10\n\t.byte 0x1\n\t.align 3\nLECIEY:\n\n"
                 ,0xe8,1,(FILE *)ctx_.fp);
          pBStack_a90 = (BuildCtx *)0x1073fd;
          fprintf((FILE *)ctx_.fp,
                  "_lj_vm_ffi_call.eh:\nLSFDEY:\n\t.set L$set$yy,LEFDEY-LASFDEY\n\t.long L$set$yy\nLASFDEY:\n\t.long LASFDEY-EH_frame2\n\t.long _lj_vm_ffi_call-.\n\t.long %d\n\t.byte 0\n\t.byte 0xe\n\t.byte 16\n\t.byte 0x86\n\t.byte 0x2\n\t.byte 0xd\n\t.byte 0x6\n\t.byte 0x83\n\t.byte 0x3\n\t.align 3\nLEFDEY:\n\n"
                  ,(ulong)uVar5);
        }
        pcVar7 = ".subsections_via_symbols\n";
        pcVar11 = (char *)0x19;
        goto LAB_0010740e;
      }
      if (ctx_.mode == BUILD_elfasm) {
        uVar5 = *(int *)(ctx_.glob + 0x99) - (int)ctx_.code;
        pBStack_a90 = (BuildCtx *)0x106c29;
        fwrite("\t.section .debug_frame,\"\",@progbits\n",0x24,1,(FILE *)ctx_.fp);
        pBStack_a90 = (BuildCtx *)0x106c44;
        fwrite(".Lframe0:\n\t.long .LECIE0-.LSCIE0\n.LSCIE0:\n\t.long 0xffffffff\n\t.byte 0x1\n\t.string \"\"\n\t.uleb128 0x1\n\t.sleb128 -8\n\t.byte 0x10\n\t.byte 0xc\n\t.uleb128 0x7\n\t.uleb128 8\n\t.byte 0x80+0x10\n\t.uleb128 0x1\n\t.align 8\n.LECIE0:\n\n"
               ,0xd2,1,(FILE *)ctx_.fp);
        pBStack_a90 = (BuildCtx *)0x106c5e;
        fprintf((FILE *)ctx_.fp,
                ".LSFDE0:\n\t.long .LEFDE0-.LASFDE0\n.LASFDE0:\n\t.long .Lframe0\n\t.quad .Lbegin\n\t.quad %d\n\t.byte 0xe\n\t.uleb128 %d\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0x83\n\t.uleb128 0x3\n\t.byte 0x8f\n\t.uleb128 0x4\n\t.byte 0x8e\n\t.uleb128 0x5\n\t.align 8\n.LEFDE0:\n\n"
                ,(ulong)uVar5,0x50);
        pBStack_a90 = (BuildCtx *)0x106c77;
        fprintf((FILE *)ctx_.fp,
                ".LSFDE1:\n\t.long .LEFDE1-.LASFDE1\n.LASFDE1:\n\t.long .Lframe0\n\t.quad lj_vm_ffi_call\n\t.quad %d\n\t.byte 0xe\n\t.uleb128 16\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0xd\n\t.uleb128 0x6\n\t.byte 0x83\n\t.uleb128 0x3\n\t.align 8\n.LEFDE1:\n\n"
                ,(ulong)((int)ctx_.codesz - uVar5));
        pBStack_a90 = (BuildCtx *)0x106c92;
        fwrite("\t.section .eh_frame,\"a\",@progbits\n",0x22,1,(FILE *)ctx_.fp);
        pBStack_a90 = (BuildCtx *)0x106cad;
        fwrite(".Lframe1:\n\t.long .LECIE1-.LSCIE1\n.LSCIE1:\n\t.long 0\n\t.byte 0x1\n\t.string \"zPR\"\n\t.uleb128 0x1\n\t.sleb128 -8\n\t.byte 0x10\n\t.uleb128 6\n\t.byte 0x1b\n\t.long lj_err_unwind_dwarf-.\n\t.byte 0x1b\n\t.byte 0xc\n\t.uleb128 0x7\n\t.uleb128 8\n\t.byte 0x80+0x10\n\t.uleb128 0x1\n\t.align 8\n.LECIE1:\n\n"
               ,0x10d,1,(FILE *)ctx_.fp);
        pBStack_a90 = (BuildCtx *)0x106cc7;
        fprintf((FILE *)ctx_.fp,
                ".LSFDE2:\n\t.long .LEFDE2-.LASFDE2\n.LASFDE2:\n\t.long .LASFDE2-.Lframe1\n\t.long .Lbegin-.\n\t.long %d\n\t.uleb128 0\n\t.byte 0xe\n\t.uleb128 %d\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0x83\n\t.uleb128 0x3\n\t.byte 0x8f\n\t.uleb128 0x4\n\t.byte 0x8e\n\t.uleb128 0x5\n\t.align 8\n.LEFDE2:\n\n"
                ,(ulong)uVar5,0x50);
        pBStack_a90 = (BuildCtx *)0x106ce2;
        fwrite(".Lframe2:\n\t.long .LECIE2-.LSCIE2\n.LSCIE2:\n\t.long 0\n\t.byte 0x1\n\t.string \"zR\"\n\t.uleb128 0x1\n\t.sleb128 -8\n\t.byte 0x10\n\t.uleb128 1\n\t.byte 0x1b\n\t.byte 0xc\n\t.uleb128 0x7\n\t.uleb128 8\n\t.byte 0x80+0x10\n\t.uleb128 0x1\n\t.align 8\n.LECIE2:\n\n"
               ,0xe3,1,(FILE *)ctx_.fp);
        pcVar11 = 
        ".LSFDE3:\n\t.long .LEFDE3-.LASFDE3\n.LASFDE3:\n\t.long .LASFDE3-.Lframe2\n\t.long lj_vm_ffi_call-.\n\t.long %d\n\t.uleb128 0\n\t.byte 0xe\n\t.uleb128 16\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0xd\n\t.uleb128 0x6\n\t.byte 0x83\n\t.uleb128 0x3\n\t.align 8\n.LEFDE3:\n\n"
        ;
        pBStack_a90 = (BuildCtx *)0x106cfb;
        fprintf((FILE *)ctx_.fp,
                ".LSFDE3:\n\t.long .LEFDE3-.LASFDE3\n.LASFDE3:\n\t.long .LASFDE3-.Lframe2\n\t.long lj_vm_ffi_call-.\n\t.long %d\n\t.uleb128 0\n\t.byte 0xe\n\t.uleb128 16\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0xd\n\t.uleb128 0x6\n\t.byte 0x83\n\t.uleb128 0x3\n\t.align 8\n.LEFDE3:\n\n"
                ,(ulong)((int)ctx_.codesz - uVar5));
      }
      break;
    case BUILD_peobj:
      pBStack_a90 = (BuildCtx *)0x1073a4;
      emit_peobj(&ctx_);
      break;
    case BUILD_raw:
      pBStack_a90 = (BuildCtx *)0x107398;
      pcVar11 = (char *)ctx_.code;
      owrite(&ctx_,ctx_.code,CONCAT44(ctx_.codesz._4_4_,(int)ctx_.codesz));
      break;
    case BUILD_bcdef:
      pBStack_a90 = (BuildCtx *)0x107303;
      fwrite("/* This is a generated file. DO NOT EDIT! */\n\n",0x2e,1,(FILE *)ctx_.fp);
      pcVar11 = (char *)0x2a;
      pBStack_a90 = (BuildCtx *)0x10731e;
      fwrite("LJ_DATADEF const uint16_t lj_bc_ofs[] = {\n",0x2a,1,(FILE *)ctx_.fp);
      if (0 < ctx_.npc) {
        unaff_R14 = (char **)0x112f77;
        lVar12 = 0;
        do {
          if (lVar12 != 0) {
            pBStack_a90 = (BuildCtx *)0x107352;
            fwrite(",\n",2,1,(FILE *)ctx_.fp);
          }
          pcVar11 = "%d";
          pBStack_a90 = (BuildCtx *)0x10736a;
          fprintf((FILE *)ctx_.fp,"%d",(ulong)(uint)ctx_.bc_ofs[lVar12]);
          lVar12 = lVar12 + 1;
        } while (lVar12 < ctx_.npc);
      }
    case BUILD_ffdef:
    case BUILD_libdef:
    case BUILD_recdef:
      pBStack_a90 = (BuildCtx *)0x107381;
      emit_lib(&ctx_);
      break;
    case BUILD_vmdef:
      pBStack_a90 = (BuildCtx *)0x106f8c;
      fwrite("-- This is a generated file. DO NOT EDIT!\n\n",0x2b,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x106fa6;
      fprintf((FILE *)ctx_.fp,
              "assert(require(\"jit\").version == \"%s\", \"LuaJIT core/library version mismatch\")\n\n"
              ,"LuaJIT 2.1.1741897244");
      pBStack_a90 = (BuildCtx *)0x106fc1;
      fwrite("return {\n\n",10,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x106fdc;
      fwrite("bcnames = \"",0xb,1,(FILE *)ctx_.fp);
      lVar12 = 0;
      do {
        pBStack_a90 = (BuildCtx *)0x107000;
        fprintf((FILE *)ctx_.fp,"%-6s",*(undefined8 *)((long)bc_names + lVar12));
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x308);
      pBStack_a90 = (BuildCtx *)0x107028;
      fwrite("\",\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x107043;
      fwrite("irnames = \"",0xb,1,(FILE *)ctx_.fp);
      lVar12 = 0;
      do {
        pBStack_a90 = (BuildCtx *)0x107067;
        fprintf((FILE *)ctx_.fp,"%-6s",*(undefined8 *)((long)ir_names + lVar12));
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x328);
      pBStack_a90 = (BuildCtx *)0x10708f;
      fwrite("\",\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x1070aa;
      fwrite("irfpm = { [0]=",0xe,1,(FILE *)ctx_.fp);
      lVar12 = 0;
      do {
        pcVar7 = irfpm_names[lVar12];
        cVar2 = *pcVar7;
        pcVar11 = buf;
        while (cVar2 != '\0') {
          pcVar7 = pcVar7 + 1;
          cVar10 = cVar2 + ' ';
          if (0x19 < (byte)(cVar2 + 0xbfU)) {
            cVar10 = cVar2;
          }
          *pcVar11 = cVar10;
          pcVar11 = pcVar11 + 1;
          cVar2 = *pcVar7;
        }
        *pcVar11 = '\0';
        pBStack_a90 = (BuildCtx *)0x10710e;
        fprintf((FILE *)ctx_.fp,"\"%s\", ",buf);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 7);
      pBStack_a90 = (BuildCtx *)0x107132;
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x10714d;
      fwrite("irfield = { [0]=",0x10,1,(FILE *)ctx_.fp);
      lVar12 = 0;
      do {
        pcVar7 = irfield_names[lVar12];
        cVar2 = *pcVar7;
        pcVar11 = buf;
        while (cVar2 != '\0') {
          pcVar7 = pcVar7 + 1;
          cVar10 = cVar2 + ' ';
          if (0x19 < (byte)(cVar2 + 0xbfU)) {
            cVar10 = cVar2;
          }
          *pcVar11 = cVar10;
          pcVar11 = pcVar11 + 1;
          cVar2 = *pcVar7;
        }
        *pcVar11 = '\0';
        pBStack_a90 = (BuildCtx *)0x1071ac;
        pcVar7 = strchr(buf,0x5f);
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '.';
        }
        pBStack_a90 = (BuildCtx *)0x1071c6;
        fprintf((FILE *)ctx_.fp,"\"%s\", ",buf);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x19);
      pBStack_a90 = (BuildCtx *)0x1071ea;
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x107205;
      fwrite("ircall = {\n[0]=",0xf,1,(FILE *)ctx_.fp);
      lVar12 = 0;
      do {
        pBStack_a90 = (BuildCtx *)0x107229;
        fprintf((FILE *)ctx_.fp,"\"%s\",\n",*(undefined8 *)((long)ircall_names + lVar12));
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x388);
      pBStack_a90 = (BuildCtx *)0x107251;
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x10726c;
      fwrite("traceerr = {\n[0]=",0x11,1,(FILE *)ctx_.fp);
      unaff_R14 = trace_errors;
      lVar12 = 0;
      do {
        pBStack_a90 = (BuildCtx *)0x107290;
        fprintf((FILE *)ctx_.fp,"\"%s\",\n",*(undefined8 *)((long)trace_errors + lVar12));
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x118);
      pBStack_a90 = (BuildCtx *)0x1072bc;
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x1072c4;
      emit_lib(&ctx_);
      pcVar7 = "}\n\n";
      pcVar11 = (char *)0x3;
LAB_0010740e:
      pBStack_a90 = (BuildCtx *)0x107418;
      fwrite(pcVar7,(size_t)pcVar11,1,(FILE *)ctx_.fp);
      break;
    case BUILD_folddef:
      pBStack_a90 = (BuildCtx *)0x1072e3;
      emit_fold(&ctx_);
    }
    pBStack_a90 = (BuildCtx *)0x107422;
    fflush((FILE *)ctx_.fp);
    argv = (char **)ctx_.fp;
    pBStack_a90 = (BuildCtx *)0x10742f;
    iVar9 = ferror((FILE *)ctx_.fp);
    if (iVar9 == 0) {
      pBStack_a90 = (BuildCtx *)0x10743b;
      fclose((FILE *)argv);
      return 0;
    }
  }
  pBStack_a90 = (BuildCtx *)0x107461;
  main_cold_2();
LAB_00107461:
  ppcVar14 = &ctx_.outname;
  pBStack_a90 = (BuildCtx *)sym_decorate;
  main_cold_1();
  pcVar7 = "";
  if (*(int *)(ppcVar14 + 1) == 2) {
    pcVar7 = "_";
  }
  pFStack_a98 = (FILE *)argv;
  pBStack_a90 = (BuildCtx *)unaff_R14;
  sprintf(acStack_ba0,"%s%s%s",pcVar7,pcVar11,extraout_RDX);
  pcVar7 = strchr(acStack_ba0,0x40);
  if (pcVar7 != (char *)0x0) {
    *pcVar7 = '\0';
  }
  sVar6 = strlen(acStack_ba0);
  pcVar7 = (char *)malloc(sVar6 + 1);
  strcpy(pcVar7,acStack_ba0);
  return (int)pcVar7;
}

Assistant:

int main(int argc, char **argv)
{
  BuildCtx ctx_;
  BuildCtx *ctx = &ctx_;
  int status, binmode;

  if (sizeof(void *) != 4*LJ_32+8*LJ_64) {
    fprintf(stderr,"Error: pointer size mismatch in cross-build.\n");
    fprintf(stderr,"Try: make HOST_CC=\"gcc -m32\" CROSS=...\n\n");
    return 1;
  }

  UNUSED(argc);
  parseargs(ctx, argv);

  if ((status = build_code(ctx))) {
    fprintf(stderr,"Error: DASM error %08x\n", status);
    return 1;
  }

  switch (ctx->mode) {
  case BUILD_peobj:
  case BUILD_raw:
    binmode = 1;
    break;
  default:
    binmode = 0;
    break;
  }

  if (ctx->outname[0] == '-' && ctx->outname[1] == '\0') {
    ctx->fp = stdout;
#if defined(_WIN32)
    if (binmode)
      _setmode(_fileno(stdout), _O_BINARY);  /* Yuck. */
#endif
  } else if (!(ctx->fp = fopen(ctx->outname, binmode ? "wb" : "w"))) {
    fprintf(stderr, "Error: cannot open output file '%s': %s\n",
	    ctx->outname, strerror(errno));
    exit(1);
  }

  switch (ctx->mode) {
  case BUILD_elfasm:
  case BUILD_coffasm:
  case BUILD_machasm:
    emit_asm(ctx);
    emit_asm_debug(ctx);
    break;
  case BUILD_peobj:
    emit_peobj(ctx);
    break;
  case BUILD_raw:
    emit_raw(ctx);
    break;
  case BUILD_bcdef:
    emit_bcdef(ctx);
    emit_lib(ctx);
    break;
  case BUILD_vmdef:
    emit_vmdef(ctx);
    emit_lib(ctx);
    fprintf(ctx->fp, "}\n\n");
    break;
  case BUILD_ffdef:
  case BUILD_libdef:
  case BUILD_recdef:
    emit_lib(ctx);
    break;
  case BUILD_folddef:
    emit_fold(ctx);
    break;
  default:
    break;
  }

  fflush(ctx->fp);
  if (ferror(ctx->fp)) {
    fprintf(stderr, "Error: cannot write to output file: %s\n",
	    strerror(errno));
    exit(1);
  }
  fclose(ctx->fp);

  return 0;
}